

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpV4Interface.hpp
# Opt level: O3

void __thiscall
ableton::discovery::
IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>
::IpV4Interface(IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>
                *this,Injected<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
                      *io,address_v4 *addr)

{
  Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog> *addr_00;
  
  addr_00 = (io->ref)._M_data;
  (this->mIo).ref._M_data = addr_00;
  platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>::
  openMulticastSocket<512ul>
            ((Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog> *)
             &this->mMulticastReceiveSocket,(address_v4 *)addr_00);
  platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>::
  openUnicastSocket<512ul>
            ((Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog> *)
             &this->mSendSocket,(address_v4 *)(this->mIo).ref._M_data);
  return;
}

Assistant:

IpV4Interface(util::Injected<IoContext> io, const asio::ip::address_v4& addr)
    : mIo(std::move(io))
    , mMulticastReceiveSocket(mIo->template openMulticastSocket<MaxPacketSize>(addr))
    , mSendSocket(mIo->template openUnicastSocket<MaxPacketSize>(addr))
  {
  }